

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O1

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,TextBoxStyle *param_1)

{
  Font *pFVar1;
  Uint64 UVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Color CVar7;
  Color CVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Uint32 UVar16;
  uint uVar17;
  bool bVar18;
  undefined7 uVar19;
  Color CVar20;
  Color CVar21;
  
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__Style_001e6d18;
  (this->super_Style).gui_ = (param_1->super_Style).gui_;
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__TextBoxStyle_001e7938;
  (this->box_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->box_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Transformable_001e8418;
  memcpy(&(this->box_).super_Shape.super_Transformable.m_origin,
         &(param_1->box_).super_Shape.super_Transformable.m_origin,0xa1);
  (this->box_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8448;
  (this->box_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Shape_001e8480;
  iVar3 = (param_1->box_).super_Shape.m_textureRect.left;
  iVar4 = (param_1->box_).super_Shape.m_textureRect.top;
  iVar5 = (param_1->box_).super_Shape.m_textureRect.width;
  iVar6 = (param_1->box_).super_Shape.m_textureRect.height;
  CVar7 = (param_1->box_).super_Shape.m_fillColor;
  CVar8 = (param_1->box_).super_Shape.m_outlineColor;
  (this->box_).super_Shape.m_texture = (param_1->box_).super_Shape.m_texture;
  (this->box_).super_Shape.m_textureRect.left = iVar3;
  (this->box_).super_Shape.m_textureRect.top = iVar4;
  (this->box_).super_Shape.m_textureRect.width = iVar5;
  (this->box_).super_Shape.m_textureRect.height = iVar6;
  (this->box_).super_Shape.m_fillColor = CVar7;
  (this->box_).super_Shape.m_outlineColor = CVar8;
  (this->box_).super_Shape.m_outlineThickness = (param_1->box_).super_Shape.m_outlineThickness;
  (this->box_).super_Shape.m_vertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->box_).super_Shape.m_vertices.m_vertices,
             &(param_1->box_).super_Shape.m_vertices.m_vertices);
  (this->box_).super_Shape.m_vertices.m_primitiveType =
       (param_1->box_).super_Shape.m_vertices.m_primitiveType;
  (this->box_).super_Shape.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->box_).super_Shape.m_outlineVertices.m_vertices,
             &(param_1->box_).super_Shape.m_outlineVertices.m_vertices);
  (this->box_).super_Shape.m_outlineVertices.m_primitiveType =
       (param_1->box_).super_Shape.m_outlineVertices.m_primitiveType;
  fVar9 = (param_1->box_).super_Shape.m_insideBounds.top;
  fVar10 = (param_1->box_).super_Shape.m_insideBounds.width;
  fVar11 = (param_1->box_).super_Shape.m_insideBounds.height;
  fVar12 = (param_1->box_).super_Shape.m_bounds.left;
  fVar13 = (param_1->box_).super_Shape.m_bounds.top;
  fVar14 = (param_1->box_).super_Shape.m_bounds.width;
  fVar15 = (param_1->box_).super_Shape.m_bounds.height;
  (this->box_).super_Shape.m_insideBounds.left = (param_1->box_).super_Shape.m_insideBounds.left;
  (this->box_).super_Shape.m_insideBounds.top = fVar9;
  (this->box_).super_Shape.m_insideBounds.width = fVar10;
  (this->box_).super_Shape.m_insideBounds.height = fVar11;
  (this->box_).super_Shape.m_bounds.left = fVar12;
  (this->box_).super_Shape.m_bounds.top = fVar13;
  (this->box_).super_Shape.m_bounds.width = fVar14;
  (this->box_).super_Shape.m_bounds.height = fVar15;
  (this->box_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8548;
  (this->box_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__RectangleShape_001e8580;
  (this->box_).m_size = (param_1->box_).m_size;
  (this->caret_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->caret_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Transformable_001e8418;
  memcpy(&(this->caret_).super_Shape.super_Transformable.m_origin,
         &(param_1->caret_).super_Shape.super_Transformable.m_origin,0xa1);
  (this->caret_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8448;
  (this->caret_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Shape_001e8480;
  iVar3 = (param_1->caret_).super_Shape.m_textureRect.left;
  iVar4 = (param_1->caret_).super_Shape.m_textureRect.top;
  iVar5 = (param_1->caret_).super_Shape.m_textureRect.width;
  iVar6 = (param_1->caret_).super_Shape.m_textureRect.height;
  CVar7 = (param_1->caret_).super_Shape.m_fillColor;
  CVar8 = (param_1->caret_).super_Shape.m_outlineColor;
  (this->caret_).super_Shape.m_texture = (param_1->caret_).super_Shape.m_texture;
  (this->caret_).super_Shape.m_textureRect.left = iVar3;
  (this->caret_).super_Shape.m_textureRect.top = iVar4;
  (this->caret_).super_Shape.m_textureRect.width = iVar5;
  (this->caret_).super_Shape.m_textureRect.height = iVar6;
  (this->caret_).super_Shape.m_fillColor = CVar7;
  (this->caret_).super_Shape.m_outlineColor = CVar8;
  (this->caret_).super_Shape.m_outlineThickness = (param_1->caret_).super_Shape.m_outlineThickness;
  (this->caret_).super_Shape.m_vertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->caret_).super_Shape.m_vertices.m_vertices,
             &(param_1->caret_).super_Shape.m_vertices.m_vertices);
  (this->caret_).super_Shape.m_vertices.m_primitiveType =
       (param_1->caret_).super_Shape.m_vertices.m_primitiveType;
  (this->caret_).super_Shape.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->caret_).super_Shape.m_outlineVertices.m_vertices,
             &(param_1->caret_).super_Shape.m_outlineVertices.m_vertices);
  (this->caret_).super_Shape.m_outlineVertices.m_primitiveType =
       (param_1->caret_).super_Shape.m_outlineVertices.m_primitiveType;
  fVar9 = (param_1->caret_).super_Shape.m_insideBounds.top;
  fVar10 = (param_1->caret_).super_Shape.m_insideBounds.width;
  fVar11 = (param_1->caret_).super_Shape.m_insideBounds.height;
  fVar12 = (param_1->caret_).super_Shape.m_bounds.left;
  fVar13 = (param_1->caret_).super_Shape.m_bounds.top;
  fVar14 = (param_1->caret_).super_Shape.m_bounds.width;
  fVar15 = (param_1->caret_).super_Shape.m_bounds.height;
  (this->caret_).super_Shape.m_insideBounds.left = (param_1->caret_).super_Shape.m_insideBounds.left
  ;
  (this->caret_).super_Shape.m_insideBounds.top = fVar9;
  (this->caret_).super_Shape.m_insideBounds.width = fVar10;
  (this->caret_).super_Shape.m_insideBounds.height = fVar11;
  (this->caret_).super_Shape.m_bounds.left = fVar12;
  (this->caret_).super_Shape.m_bounds.top = fVar13;
  (this->caret_).super_Shape.m_bounds.width = fVar14;
  (this->caret_).super_Shape.m_bounds.height = fVar15;
  (this->caret_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8548;
  (this->caret_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__RectangleShape_001e8580;
  (this->caret_).m_size = (param_1->caret_).m_size;
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Transformable_001e8418
  ;
  memcpy(&(this->text_).super_Transformable.m_origin,&(param_1->text_).super_Transformable.m_origin,
         0xa1);
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_001e8638;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_001e8660;
  sf::String::String(&(this->text_).m_string,&(param_1->text_).m_string);
  (this->text_).m_outlineThickness = (param_1->text_).m_outlineThickness;
  pFVar1 = (param_1->text_).m_font;
  uVar17 = (param_1->text_).m_characterSize;
  fVar9 = (param_1->text_).m_letterSpacingFactor;
  UVar16 = (param_1->text_).m_style;
  CVar7 = (param_1->text_).m_fillColor;
  CVar8 = (param_1->text_).m_outlineColor;
  (this->text_).m_lineSpacingFactor = (param_1->text_).m_lineSpacingFactor;
  (this->text_).m_style = UVar16;
  (this->text_).m_fillColor = CVar7;
  (this->text_).m_outlineColor = CVar8;
  (this->text_).m_font = pFVar1;
  (this->text_).m_characterSize = uVar17;
  (this->text_).m_letterSpacingFactor = fVar9;
  (this->text_).m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_vertices.m_vertices,&(param_1->text_).m_vertices.m_vertices);
  (this->text_).m_vertices.m_primitiveType = (param_1->text_).m_vertices.m_primitiveType;
  (this->text_).m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_outlineVertices.m_vertices,
             &(param_1->text_).m_outlineVertices.m_vertices);
  (this->text_).m_outlineVertices.m_primitiveType =
       (param_1->text_).m_outlineVertices.m_primitiveType;
  fVar9 = (param_1->text_).m_bounds.top;
  fVar10 = (param_1->text_).m_bounds.width;
  fVar11 = (param_1->text_).m_bounds.height;
  bVar18 = (param_1->text_).m_geometryNeedUpdate;
  uVar19 = *(undefined7 *)&(param_1->text_).field_0x161;
  UVar2 = (param_1->text_).m_fontTextureId;
  (this->text_).m_bounds.left = (param_1->text_).m_bounds.left;
  (this->text_).m_bounds.top = fVar9;
  (this->text_).m_bounds.width = fVar10;
  (this->text_).m_bounds.height = fVar11;
  (this->text_).m_geometryNeedUpdate = bVar18;
  *(undefined7 *)&(this->text_).field_0x161 = uVar19;
  (this->text_).m_fontTextureId = UVar2;
  CVar7 = param_1->readOnlyBoxColor_;
  CVar8 = param_1->textColor_;
  CVar20 = param_1->defaultTextColor_;
  CVar21 = param_1->defaultTextColor_;
  fVar9 = (param_1->textPadding_).x;
  fVar10 = (param_1->textPadding_).y;
  fVar11 = (param_1->textPadding_).z;
  this->boxColor_ = param_1->boxColor_;
  this->readOnlyBoxColor_ = CVar7;
  this->textColor_ = CVar8;
  this->defaultTextColor_ = CVar20;
  this->defaultTextColor_ = CVar21;
  (this->textPadding_).x = fVar9;
  (this->textPadding_).y = fVar10;
  (this->textPadding_).z = fVar11;
  return;
}

Assistant:

virtual ~TextBoxStyle() = default;